

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O3

FT_Error ps_dimension_set_mask_bits
                   (PS_Dimension dim,FT_Byte *source,FT_UInt source_pos,FT_UInt source_bits,
                   FT_UInt end_point,FT_Memory memory)

{
  PS_Mask_TableRec *table;
  FT_Error FVar1;
  PS_Mask in_RAX;
  ulong uVar2;
  byte bVar3;
  byte *pbVar4;
  uint uVar5;
  uint uVar7;
  uint uVar8;
  byte *pbVar9;
  PS_Mask mask;
  PS_Mask local_38;
  uint uVar6;
  
  table = &dim->masks;
  uVar2 = (ulong)(dim->masks).num_masks;
  if (uVar2 != 0) {
    (dim->masks).masks[uVar2 - 1].end_point = end_point;
  }
  local_38 = in_RAX;
  FVar1 = ps_mask_table_alloc(table,memory,&local_38);
  if (FVar1 == 0) {
    if ((ulong)table->num_masks == 0) {
      FVar1 = ps_mask_table_alloc(table,memory,&local_38);
      if (FVar1 != 0) {
        return FVar1;
      }
    }
    else {
      local_38 = (dim->masks).masks + ((ulong)table->num_masks - 1);
    }
    FVar1 = ps_mask_ensure(local_38,source_bits,memory);
    if (FVar1 == 0) {
      local_38->num_bits = source_bits;
      FVar1 = 0;
      if (source_bits != 0) {
        pbVar4 = local_38->bytes;
        pbVar9 = source + (source_pos >> 3);
        uVar6 = 0x80;
        uVar7 = 0x80 >> ((byte)source_pos & 7);
        do {
          uVar5 = (int)uVar6 >> 1;
          if (uVar6 < 2) {
            uVar5 = 0x80;
          }
          uVar8 = uVar7 >> 1;
          if (uVar7 < 2) {
            uVar8 = 0x80;
          }
          bVar3 = (byte)uVar6 | *pbVar4;
          if ((uVar7 & *pbVar9) == 0) {
            bVar3 = ~(byte)uVar6 & *pbVar4;
          }
          *pbVar4 = bVar3;
          source_bits = source_bits - 1;
          pbVar4 = pbVar4 + (uVar6 < 2);
          pbVar9 = pbVar9 + (uVar7 < 2);
          FVar1 = 0;
          uVar6 = uVar5;
          uVar7 = uVar8;
        } while (source_bits != 0);
      }
    }
  }
  return FVar1;
}

Assistant:

static FT_Error
  ps_dimension_set_mask_bits( PS_Dimension    dim,
                              const FT_Byte*  source,
                              FT_UInt         source_pos,
                              FT_UInt         source_bits,
                              FT_UInt         end_point,
                              FT_Memory       memory )
  {
    FT_Error  error;


    /* reset current mask, if any */
    error = ps_dimension_reset_mask( dim, end_point, memory );
    if ( error )
      goto Exit;

    /* set bits in new mask */
    error = ps_mask_table_set_bits( &dim->masks, source,
                                    source_pos, source_bits, memory );

  Exit:
    return error;
  }